

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O3

void __thiscall
chrono::fea::BrickGravity::Evaluate
          (BrickGravity *this,ChVectorN<double,_8> *result,double x,double y,double z)

{
  undefined1 auVar1 [16];
  ChElementHexaANCF_3813 *pCVar2;
  ChMatrixNM<double,_8,_3> *pCVar3;
  ActualDstType actualDst;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar28;
  undefined1 auVar26 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar27 [32];
  
  dVar22 = x;
  ChElementHexaANCF_3813::ShapeFunctions((ChElementHexaANCF_3813 *)this,&this->N,x,y,z);
  dVar23 = y;
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeX(this->element,&this->Nx,dVar22,y,z);
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeY(this->element,&this->Ny,x,dVar23,z);
  pCVar2 = this->element;
  auVar7._8_8_ = 0x3ff0000000000000;
  auVar7._0_8_ = 0x3ff0000000000000;
  pCVar3 = this->d0;
  auVar13 = vshufpd_avx(auVar7,auVar7,3);
  dVar22 = (2.0 / (pCVar2->m_InertFlexVec).m_data[2]) * 0.125;
  auVar20 = vpermpd_avx2(ZEXT1632(CONCAT88((x + 1.0) * dVar22,(1.0 - x) * dVar22)),0x14);
  auVar25._0_8_ = (1.0 - y) * auVar20._0_8_;
  auVar25._8_8_ = (1.0 - y) * auVar20._8_8_;
  auVar27._16_8_ = (y + auVar13._0_8_) * auVar20._16_8_;
  auVar27._0_16_ = auVar25;
  auVar27._24_8_ = (y + auVar13._8_8_) * auVar20._24_8_;
  auVar20._8_8_ = 0x8000000000000000;
  auVar20._0_8_ = 0x8000000000000000;
  auVar20._16_8_ = 0x8000000000000000;
  auVar20._24_8_ = 0x8000000000000000;
  auVar20 = vxorpd_avx512vl(auVar27,auVar20);
  auVar4 = vmovddup_avx512vl(auVar25);
  *(undefined1 (*) [32])
   (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array =
       auVar20;
  *(undefined1 (*) [32])
   ((this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array +
   4) = auVar27;
  auVar13 = *(undefined1 (*) [16])
             (pCVar3->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data
             .array;
  dVar22 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[0];
  auVar43._8_8_ = dVar22;
  auVar43._0_8_ = dVar22;
  auVar14 = *(undefined1 (*) [16])
             ((pCVar3->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 3);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       (pCVar3->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
       [5];
  auVar15 = *(undefined1 (*) [16])
             ((pCVar3->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 6);
  auVar1 = *(undefined1 (*) [16])
            ((pCVar3->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data
             .array + 9);
  dVar22 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[3];
  auVar41._8_8_ = dVar22;
  auVar41._0_8_ = dVar22;
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (pCVar3->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
       [2];
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (pCVar3->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
       [0xb];
  auVar17 = *(undefined1 (*) [16])
             ((pCVar3->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0xc);
  dVar22 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[4];
  auVar39._8_8_ = dVar22;
  auVar39._0_8_ = dVar22;
  auVar18 = *(undefined1 (*) [16])
             ((pCVar3->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0xf);
  auVar19 = *(undefined1 (*) [16])
             ((pCVar3->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0x12);
  auVar26 = *(undefined1 (*) [16])
             ((pCVar3->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0x15);
  dVar22 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[7];
  auVar35._8_8_ = dVar22;
  auVar35._0_8_ = dVar22;
  auVar5 = vmulpd_avx512vl(auVar13,auVar43);
  dVar22 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[1];
  auVar6._8_8_ = dVar22;
  auVar6._0_8_ = dVar22;
  auVar6 = vfmadd231pd_avx512vl(auVar5,auVar14,auVar6);
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       (pCVar3->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
       [8];
  auVar7 = vunpcklpd_avx512vl(auVar37,auVar47);
  auVar8 = vmulpd_avx512vl(auVar7,*(undefined1 (*) [16])
                                   ((this->Ny).
                                    super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                                    m_storage.m_data.array + 1));
  auVar9 = vunpcklpd_avx512vl(auVar38,auVar34);
  dVar22 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[2];
  auVar5._8_8_ = dVar22;
  auVar5._0_8_ = dVar22;
  auVar6 = vfmadd231pd_avx512vl(auVar6,auVar15,auVar5);
  auVar5 = vfmadd231pd_fma(auVar6,auVar1,auVar41);
  auVar6 = vunpcklpd_avx(auVar43,auVar41);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (pCVar3->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
       [0x17];
  auVar10 = vmulpd_avx512vl(auVar9,auVar6);
  auVar6 = vfmadd231pd_fma(auVar5,auVar17,auVar39);
  dVar22 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[5];
  auVar11._8_8_ = dVar22;
  auVar11._0_8_ = dVar22;
  auVar6 = vfmadd231pd_avx512vl(auVar6,auVar18,auVar11);
  auVar11 = vaddpd_avx512vl(auVar8,auVar10);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       (pCVar3->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
       [0x14];
  dVar22 = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[6];
  auVar8._8_8_ = dVar22;
  auVar8._0_8_ = dVar22;
  auVar6 = vfmadd231pd_avx512vl(auVar6,auVar19,auVar8);
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       (pCVar3->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
       [0xe];
  auVar8 = vunpcklpd_avx512vl(auVar46,auVar44);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       (pCVar3->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
       [0x11];
  auVar12 = vunpcklpd_avx512vl(auVar45,auVar42);
  auVar10 = vmulpd_avx512vl(auVar12,*(undefined1 (*) [16])
                                     ((this->Ny).
                                      super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                                      m_storage.m_data.array + 5));
  auVar5 = vfmadd231pd_fma(auVar6,auVar26,auVar35);
  auVar6 = vunpcklpd_avx(auVar39,auVar35);
  auVar6 = vmulpd_avx512vl(auVar8,auVar6);
  auVar6 = vaddpd_avx512vl(auVar10,auVar6);
  auVar16 = auVar20._0_16_;
  auVar10 = vmovddup_avx512vl(auVar16);
  dVar23 = auVar6._0_8_ + auVar6._8_8_ + auVar11._0_8_ + auVar11._8_8_;
  dVar22 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[0];
  auVar31._8_8_ = dVar22;
  auVar31._0_8_ = dVar22;
  auVar6 = vmulpd_avx512vl(auVar13,auVar31);
  auVar13 = vmulpd_avx512vl(auVar10,auVar13);
  auVar11 = vshufps_avx512vl(auVar16,auVar16,0xee);
  dVar22 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[1];
  auVar10._8_8_ = dVar22;
  auVar10._0_8_ = dVar22;
  auVar10 = vfmadd231pd_avx512vl(auVar6,auVar14,auVar10);
  auVar13 = vfmadd231pd_avx512vl(auVar13,auVar14,auVar11);
  auVar11 = vextractf32x4_avx512vl(auVar20,1);
  auVar6 = vshufpd_avx(auVar16,auVar25,1);
  auVar14 = vmovddup_avx512vl(auVar11);
  dVar22 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[2];
  auVar16._8_8_ = dVar22;
  auVar16._0_8_ = dVar22;
  auVar10 = vfmadd231pd_avx512vl(auVar10,auVar15,auVar16);
  auVar14 = vfmadd231pd_avx512vl(auVar13,auVar15,auVar14);
  auVar15 = vshufps_avx512vl(auVar11,auVar11,0xee);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar16 = vmovddup_avx512vl(auVar13);
  auVar13 = vfmadd231pd_avx512vl(auVar14,auVar1,auVar15);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar14 = vmovddup_avx512vl(auVar14);
  auVar4 = vfmadd231pd_avx512vl(auVar13,auVar17,auVar4);
  auVar13 = vfmadd231pd_avx512vl(auVar10,auVar1,auVar14);
  auVar14 = vunpcklpd_avx512vl(auVar31,auVar14);
  auVar10 = vmulpd_avx512vl(auVar12,*(undefined1 (*) [16])
                                     ((this->Nx).
                                      super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                                      m_storage.m_data.array + 5));
  auVar9 = vmulpd_avx512vl(auVar14,auVar9);
  auVar13 = vfmadd231pd_avx512vl(auVar13,auVar17,auVar16);
  auVar17 = vmulpd_avx512vl(auVar7,*(undefined1 (*) [16])
                                    ((this->Nx).
                                     super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                                     m_storage.m_data.array + 1));
  dVar22 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[5];
  auVar15._8_8_ = dVar22;
  auVar15._0_8_ = dVar22;
  auVar13 = vfmadd231pd_avx512vl(auVar13,auVar18,auVar15);
  dVar22 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[6];
  auVar1._8_8_ = dVar22;
  auVar1._0_8_ = dVar22;
  auVar14 = vfmadd231pd_avx512vl(auVar13,auVar19,auVar1);
  auVar13 = vshufpd_avx(auVar25,auVar25,3);
  auVar13 = vfmadd231pd_avx512vl(auVar4,auVar18,auVar13);
  auVar7 = auVar27._16_16_;
  auVar40._8_8_ = auVar27._16_8_;
  auVar40._0_8_ = auVar27._16_8_;
  auVar15 = vfmadd231pd_avx512vl(auVar13,auVar19,auVar40);
  dVar22 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[7];
  auVar30._8_8_ = dVar22;
  auVar30._0_8_ = dVar22;
  auVar13 = vunpcklpd_avx512vl(auVar16,auVar30);
  auVar1 = vfmadd231pd_fma(auVar14,auVar26,auVar30);
  auVar14 = vunpcklpd_avx512vl(auVar37,auVar46);
  auVar12._0_8_ = auVar14._0_8_ * auVar6._0_8_;
  auVar12._8_8_ = auVar14._8_8_ * auVar6._8_8_;
  auVar14 = vunpcklpd_avx512vl(auVar38,auVar45);
  auVar13 = vmulpd_avx512vl(auVar13,auVar8);
  auVar4._0_8_ = auVar25._0_8_ * auVar14._0_8_;
  auVar4._8_8_ = auVar25._8_8_ * auVar14._8_8_;
  auVar18 = vshufpd_avx512vl(auVar11,auVar7,1);
  auVar19 = vaddpd_avx512vl(auVar10,auVar13);
  auVar13 = vaddsubpd_avx(auVar12,auVar4);
  auVar14 = vunpcklpd_avx(auVar34,auVar42);
  auVar29._0_8_ = auVar14._0_8_ * auVar18._0_8_;
  auVar29._8_8_ = auVar14._8_8_ * auVar18._8_8_;
  auVar14 = vunpcklpd_avx512vl(auVar47,auVar44);
  auVar32._0_8_ = auVar27._16_8_ * auVar14._0_8_;
  auVar32._8_8_ = auVar27._24_8_ * auVar14._8_8_;
  auVar14 = vshufpd_avx(auVar7,auVar7,3);
  auVar18 = vfmadd231pd_avx512vl(auVar15,auVar26,auVar14);
  auVar14 = vaddsubpd_avx(auVar29,auVar32);
  auVar15 = vshufpd_avx(auVar5,auVar5,1);
  dVar22 = auVar19._0_8_ + auVar19._8_8_ +
           auVar17._0_8_ + auVar9._0_8_ + auVar17._8_8_ + auVar9._8_8_;
  auVar19 = vshufpd_avx512vl(auVar18,auVar18,1);
  dVar24 = auVar13._0_8_ + auVar14._0_8_;
  dVar28 = auVar13._8_8_ + auVar14._8_8_;
  auVar13 = vshufpd_avx(auVar1,auVar1,1);
  auVar26._0_8_ = dVar24 + dVar28;
  auVar26._8_8_ = dVar24 + dVar28;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar22 * auVar15._0_8_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar23;
  auVar14 = vfmsub231sd_fma(auVar9,auVar13,auVar36);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar22 * auVar19._0_8_;
  auVar17 = vfmsub231sd_fma(auVar17,auVar13,auVar26);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar23 * auVar19._0_8_;
  auVar15 = vfmsub231sd_fma(auVar33,auVar15,auVar26);
  auVar14 = vmulsd_avx512f(auVar18,auVar14);
  auVar18._8_8_ = 0x3fe0000000000000;
  auVar18._0_8_ = 0x3fe0000000000000;
  auVar18 = vmulpd_avx512vl(*(undefined1 (*) [16])((pCVar2->m_InertFlexVec).m_data + 1),auVar18);
  auVar13 = vshufpd_avx(auVar18,auVar18,1);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       auVar13._0_8_ *
       auVar18._0_8_ *
       (pCVar2->m_InertFlexVec).m_data[0] * 0.5 *
       (auVar14._0_8_ + (auVar1._0_8_ * auVar15._0_8_ - auVar17._0_8_ * auVar5._0_8_));
  auVar21 = vbroadcastsd_avx512f(auVar19);
  auVar21 = vmulpd_avx512f(auVar21,*(undefined1 (*) [64])
                                    (this->N).
                                    super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                                    m_storage.m_data.array);
  *(undefined1 (*) [64])
   (result->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.array =
       auVar21;
  return;
}

Assistant:

void BrickGravity::Evaluate(ChVectorN<double, 8>& result, const double x, const double y, const double z) {
    element->ShapeFunctions(N, x, y, z);
    element->ShapeFunctionsDerivativeX(Nx, x, y, z);
    element->ShapeFunctionsDerivativeY(Ny, x, y, z);
    element->ShapeFunctionsDerivativeZ(Nz, x, y, z);

    // Weights for Gaussian integration
    double wx2 = (element->GetLengthX()) / 2;
    double wy2 = (element->GetLengthY()) / 2;
    double wz2 = (element->GetLengthZ()) / 2;

    ChMatrixNM<double, 3, 3> rd0;
    rd0.col(0) = (*d0).transpose() * Nx.transpose();
    rd0.col(1) = (*d0).transpose() * Ny.transpose();
    rd0.col(2) = (*d0).transpose() * Nz.transpose();
    double detJ0 = rd0.determinant();

    result = detJ0 * wx2 * wy2 * wz2 * N.transpose();
}